

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_pedersen_commit
              (secp256k1_context *ctx,secp256k1_pedersen_commitment *commit,uchar *blind,
              uint64_t value,secp256k1_generator *value_gen,secp256k1_generator *blind_gen)

{
  uint uVar1;
  int overflow;
  secp256k1_scalar local_1d0;
  secp256k1_gej rj;
  secp256k1_ge r;
  secp256k1_ge blind_genp;
  secp256k1_ge value_genp;
  
  secp256k1_generator_load(&value_genp,value_gen);
  secp256k1_generator_load(&blind_genp,blind_gen);
  secp256k1_scalar_set_b32(&local_1d0,blind,&overflow);
  uVar1 = 0;
  if (overflow == 0) {
    secp256k1_pedersen_ecmult(&rj,&local_1d0,value,&value_genp,&blind_genp);
    if (rj.infinity == 0) {
      secp256k1_ge_set_gej(&r,&rj);
      secp256k1_pedersen_commitment_save(commit,&r);
    }
    uVar1 = (uint)(rj.infinity == 0);
    secp256k1_gej_clear(&rj);
    secp256k1_ge_clear(&r);
  }
  return uVar1;
}

Assistant:

int secp256k1_pedersen_commit(const secp256k1_context* ctx, secp256k1_pedersen_commitment *commit, const unsigned char *blind, uint64_t value, const secp256k1_generator* value_gen, const secp256k1_generator* blind_gen) {
    secp256k1_ge value_genp;
    secp256k1_ge blind_genp;
    secp256k1_gej rj;
    secp256k1_ge r;
    secp256k1_scalar sec;
    int overflow;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(commit != NULL);
    ARG_CHECK(blind != NULL);
    ARG_CHECK(value_gen != NULL);
    ARG_CHECK(blind_gen != NULL);
    secp256k1_generator_load(&value_genp, value_gen);
    secp256k1_generator_load(&blind_genp, blind_gen);
    secp256k1_scalar_set_b32(&sec, blind, &overflow);
    if (!overflow) {
        secp256k1_pedersen_ecmult(&rj, &sec, value, &value_genp, &blind_genp);
        if (!secp256k1_gej_is_infinity(&rj)) {
            secp256k1_ge_set_gej(&r, &rj);
            secp256k1_pedersen_commitment_save(commit, &r);
            ret = 1;
        }
        secp256k1_gej_clear(&rj);
        secp256k1_ge_clear(&r);
    }
    secp256k1_scalar_clear(&sec);
    return ret;
}